

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetMessage
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  int32_t field_number;
  Field *this_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_3
  extraout_RDX;
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> SVar1;
  Span<const_google::protobuf::json_internal::UntypedMessage> local_40;
  reference local_30;
  size_t local_28;
  size_t idx_local;
  Msg *msg_local;
  Field f_local;
  
  local_28 = idx;
  idx_local = (size_t)msg;
  msg_local = (Msg *)f;
  f_local = (Field)this;
  this_00 = ResolverPool::Field::proto(f);
  field_number = Field::number(this_00);
  local_40 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage>(msg,field_number);
  local_30 = absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage>::
             operator[](&local_40,local_28);
  absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*,_0>
            ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)this,&local_30);
  SVar1.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.data_ =
       extraout_RDX.data_;
  SVar1.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
        )this;
  return (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>)
         SVar1.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>;
}

Assistant:

static absl::StatusOr<const Msg*> GetMessage(Field f, const Msg& msg,
                                               size_t idx = 0) {
    return &msg.Get<Msg>(f->proto().number())[idx];
  }